

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O1

void duckdb::TupleDataStructWithinCollectionGather
               (TupleDataLayout *layout,Vector *heap_locations,idx_t list_size_before,
               SelectionVector *scan_sel,idx_t scan_count,Vector *target,SelectionVector *target_sel
               ,optional_ptr<duckdb::Vector,_true> list_vector,
               vector<duckdb::TupleDataGatherFunction,_true> *child_functions)

{
  ulong *puVar1;
  data_ptr_t pdVar2;
  unsigned_long *puVar3;
  long lVar4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  TupleDataLayout *pTVar9;
  ulong uVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  reference this_01;
  type pVVar12;
  const_reference pvVar13;
  size_type __n;
  ulong uVar14;
  ulong uVar15;
  ulong *puVar16;
  idx_t iVar17;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  TupleDataLayout *local_88;
  idx_t local_80;
  ulong local_78;
  data_ptr_t local_70;
  Vector *local_68;
  Vector *local_60;
  SelectionVector *local_58;
  buffer_ptr<ValidityBuffer> *local_50;
  idx_t local_48;
  optional_ptr<duckdb::Vector,_true> list_vector_local;
  idx_t local_38;
  
  list_vector_local = list_vector;
  local_88 = layout;
  local_58 = scan_sel;
  optional_ptr<duckdb::Vector,_true>::CheckValid(&list_vector_local);
  pdVar2 = (list_vector_local.ptr)->data;
  optional_ptr<duckdb::Vector,_true>::CheckValid(&list_vector_local);
  local_68 = list_vector_local.ptr;
  FlatVector::VerifyFlatVector(list_vector_local.ptr);
  local_70 = heap_locations->data;
  FlatVector::VerifyFlatVector(target);
  iVar17 = list_size_before;
  local_60 = heap_locations;
  if (scan_count != 0) {
    local_50 = &(target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    uVar14 = 0;
    local_80 = list_size_before;
    local_78 = scan_count;
    do {
      uVar10 = uVar14;
      if (target_sel->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)target_sel->sel_vector[uVar14];
      }
      puVar3 = (local_68->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0)) {
        lVar4 = *(long *)(pdVar2 + uVar10 * 0x10 + 8);
        if (lVar4 != 0) {
          puVar16 = (ulong *)(pdVar2 + uVar10 * 0x10 + 8);
          lVar5 = *(long *)(local_70 + uVar14 * 8);
          *(ulong *)(local_70 + uVar14 * 8) = (lVar4 + 7U >> 3) + lVar5;
          uVar10 = *puVar16;
          if (uVar10 != 0) {
            uVar15 = 0;
            local_48 = list_size_before;
            do {
              if ((*(byte *)(lVar5 + (uVar15 >> 3)) >> ((uint)uVar15 & 7) & 1) == 0) {
                if ((target->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_38 = (target->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_98,&local_38);
                  p_Var8 = p_Stack_90;
                  peVar7 = local_98;
                  local_98 = (element_type *)0x0;
                  p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                  (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar7;
                  (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var8;
                  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                  }
                  if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                  }
                  pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(local_50);
                  (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar11->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                  list_size_before = local_48;
                }
                bVar6 = (byte)(list_size_before + uVar15) & 0x3f;
                puVar1 = (target->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                         + (list_size_before + uVar15 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
              }
              uVar15 = uVar15 + 1;
              uVar10 = *puVar16;
            } while (uVar15 < uVar10);
          }
          list_size_before = list_size_before + uVar10;
          scan_count = local_78;
          iVar17 = local_80;
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != scan_count);
  }
  this_00 = StructVector::GetEntries(target);
  pTVar9 = local_88;
  if ((this_00->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this_00->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      this_01 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::operator[](this_00,__n);
      pVVar12 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (this_01);
      pvVar13 = vector<duckdb::TupleDataGatherFunction,_true>::operator[](child_functions,__n);
      (*pvVar13->function)
                (pTVar9,local_60,iVar17,local_58,scan_count,pVVar12,target_sel,
                 (optional_ptr<duckdb::Vector,_true>)list_vector_local.ptr,&pvVar13->child_functions
                );
      __n = __n + 1;
    } while (__n < (ulong)((long)(this_00->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

static void TupleDataStructWithinCollectionGather(const TupleDataLayout &layout, Vector &heap_locations,
                                                  const idx_t list_size_before, const SelectionVector &scan_sel,
                                                  const idx_t scan_count, Vector &target,
                                                  const SelectionVector &target_sel, optional_ptr<Vector> list_vector,
                                                  const vector<TupleDataGatherFunction> &child_functions) {
	// List parent
	const auto list_entries = FlatVector::GetData<list_entry_t>(*list_vector);
	const auto &list_validity = FlatVector::Validity(*list_vector);

	// Source
	const auto source_heap_locations = FlatVector::GetData<data_ptr_t>(heap_locations);

	// Target
	auto &target_validity = FlatVector::Validity(target);

	uint64_t target_offset = list_size_before;
	for (idx_t i = 0; i < scan_count; i++) {
		const auto target_idx = target_sel.get_index(i);
		if (!list_validity.RowIsValid(target_idx)) {
			continue;
		}

		const auto &list_length = list_entries[target_idx].length;
		if (list_length == 0) {
			continue;
		}

		// Initialize validity mask and skip over it
		auto &source_heap_location = source_heap_locations[i];
		ValidityBytes source_mask(source_heap_location, list_length);
		source_heap_location += ValidityBytes::SizeInBytes(list_length);

		// Load the child validity belonging to this list entry
		for (idx_t child_i = 0; child_i < list_length; child_i++) {
			if (!source_mask.RowIsValidUnsafe(child_i)) {
				target_validity.SetInvalid(target_offset + child_i);
			}
		}
		target_offset += list_length;
	}

	// Recurse
	auto &struct_targets = StructVector::GetEntries(target);
	for (idx_t struct_col_idx = 0; struct_col_idx < struct_targets.size(); struct_col_idx++) {
		auto &struct_target = *struct_targets[struct_col_idx];
		const auto &struct_gather_function = child_functions[struct_col_idx];
		struct_gather_function.function(layout, heap_locations, list_size_before, scan_sel, scan_count, struct_target,
		                                target_sel, list_vector, struct_gather_function.child_functions);
	}
}